

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxConversion.cpp
# Opt level: O0

vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *
Jinx::Impl::ParseRow
          (vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *__return_storage_ptr__,
          char delimiter,NumericFormat format,char **current,char *end)

{
  bool bVar1;
  char *end_00;
  int local_90;
  undefined1 local_88 [7];
  char nc;
  Variant val;
  undefined1 local_50 [8];
  String str;
  char *end_local;
  char **current_local;
  NumericFormat format_local;
  char delimiter_local;
  vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *variants;
  
  str.field_2._M_local_buf[0xf] = '\0';
  end_00 = end;
  std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::vector(__return_storage_ptr__);
  do {
    if (*current == end) {
      return __return_storage_ptr__;
    }
    ParseCell_abi_cxx11_
              ((String *)local_50,(Impl *)(ulong)(uint)(int)delimiter,(char)current,(char **)end,
               end_00);
    ParseValue((Variant *)local_88,(String *)local_50,format);
    std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::push_back
              (__return_storage_ptr__,(value_type *)local_88);
    if (*current == end) {
LAB_00135e76:
      local_90 = 0;
    }
    else {
      if (**current == delimiter) {
        *current = *current + 1;
        goto LAB_00135e76;
      }
      bVar1 = IsLineEnd(**current);
      if (!bVar1) goto LAB_00135e76;
      if ((*current != end) && (bVar1 = IsLineEnd((*current)[1]), bVar1)) {
        *current = *current + 1;
      }
      *current = *current + 1;
      local_90 = 3;
    }
    Variant::~Variant((Variant *)local_88);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_50);
    if (local_90 != 0) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

inline_t std::vector<Variant, Jinx::Allocator<Variant>> ParseRow(char delimiter, NumericFormat format, const char ** current, const char * end)
	{
		std::vector<Variant, Jinx::Allocator<Variant>> variants;

		while (*current != end)
		{
			auto str = ParseCell(delimiter, current, end);
			auto val = ParseValue(str, format);
			variants.push_back(val);
			if (*current != end)
			{
				if (**current == delimiter)
				{
					++(*current);
				}
				else if (IsLineEnd(**current))
				{
					if (*current != end)
					{
						const char nc = *((*current) + 1);
						if (IsLineEnd(nc))
							++(*current);
					}
					++(*current);
					break;
				}
			}
		}

		return variants;
	}